

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

bool isItRandom<GeneralHash<0,unsigned_int,unsigned_char>>(uint L)

{
  uint uVar1;
  int k;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  GeneralHash<0,_unsigned_int,_unsigned_char> base;
  GeneralHash<0,_unsigned_int,_unsigned_char> hf;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"checking that it is randomized ");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,5,(allocator_type *)&base);
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[lVar6] = (uchar)lVar6;
  }
  GeneralHash<0,_unsigned_int,_unsigned_char>::GeneralHash(&base,5,L);
  uVar2 = GeneralHash<0,unsigned_int,unsigned_char>::
          hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((GeneralHash<0,unsigned_int,unsigned_char> *)&base,&data);
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 100) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Not randomized! ");
      std::endl<char,std::char_traits<char>>(poVar5);
      break;
    }
    GeneralHash<0,_unsigned_int,_unsigned_char>::GeneralHash(&hf,5,L);
    uVar4 = GeneralHash<0,unsigned_int,unsigned_char>::
            hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((GeneralHash<0,unsigned_int,unsigned_char> *)&hf,&data);
    if (uVar4 == uVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,"collision ");
      poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"It is randomized! ");
    }
    std::endl<char,std::char_traits<char>>(poVar5);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&hf.precomputedshift.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
    ;
    uVar1 = uVar3 + 1;
  } while (uVar4 == uVar2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&base.precomputedshift.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar3 < 100;
}

Assistant:

bool isItRandom(uint L = 19) {
  cout << "checking that it is randomized " << endl;
  int n = 5;
  vector<unsigned char> data(n);
  for (int k = 0; k < n; ++k) {
    data[k] = static_cast<unsigned char>(k);
  }
  hashfunction base(n, L);
  uint64 x = base.hash(data);
  for (int k = 0; k < 100; ++k) {
    hashfunction hf(n, L);
    uint64 y = hf.hash(data);
    if (y != x) {
      cout << "It is randomized! " << endl;
      return true;
    }
    cout << "collision " << y << endl;
  }
  cout << "Not randomized! " << endl;
  return false; // we conclude that it always hashes to the same value (this is
                // bad)
}